

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::PatchScopedGetMethod<true,Js::InlineCache>
              (FunctionBody *functionBody,InlineCache *inlineCache,InlineCacheIndex inlineCacheIndex
              ,Var instance,PropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  ScriptContext *scriptContext_00;
  ThreadContext *this;
  PropertyRecord *this_00;
  char16 *varName;
  JavascriptLibrary *this_01;
  FunctionBody *local_98;
  Var value;
  undefined1 local_88 [7];
  bool isRoot;
  PropertyValueInfo info;
  RecyclableObject *object;
  ScriptContext *scriptContext;
  PropertyId propertyId_local;
  Var instance_local;
  InlineCacheIndex inlineCacheIndex_local;
  InlineCache *inlineCache_local;
  FunctionBody *functionBody_local;
  
  if (inlineCache == (InlineCache *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x20c1,"(inlineCache != nullptr)","inlineCache != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  scriptContext_00 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  info.inlineCacheIndex = 0;
  info.isFunctionPIC = false;
  info.allowResizingPolymorphicInlineCache = false;
  info._62_2_ = 0;
  BVar3 = GetPropertyObject(instance,scriptContext_00,(RecyclableObject **)&info.inlineCacheIndex);
  if (BVar3 == 0) {
    this = ScriptContext::GetThreadContext(scriptContext_00);
    bVar2 = ThreadContext::RecordImplicitException(this);
    if (bVar2) {
      this_00 = ScriptContext::GetPropertyName(scriptContext_00,propertyId);
      varName = PropertyRecord::GetBuffer(this_00);
      JavascriptError::ThrowTypeError(scriptContext_00,-0x7ff5ec48,varName);
    }
    this_01 = ScriptContext::GetLibrary(scriptContext_00);
    functionBody_local =
         (FunctionBody *)JavascriptLibraryBase::GetUndefined(&this_01->super_JavascriptLibraryBase);
  }
  else {
    PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)local_88);
    PropertyValueInfo::SetCacheInfo
              ((PropertyValueInfo *)local_88,functionBody,inlineCache,inlineCacheIndex,false);
    value._7_1_ = VarIs<Js::RootObjectBase,Js::RecyclableObject>((RecyclableObject *)info._56_8_);
    bVar2 = CacheOperators::TryGetProperty<true,true,true,false,true,false,true,false,false,false>
                      (instance,(bool)value._7_1_,(RecyclableObject *)info._56_8_,propertyId,
                       &local_98,scriptContext_00,(PropertyCacheOperationInfo *)0x0,
                       (PropertyValueInfo *)local_88);
    if (bVar2) {
      functionBody_local = local_98;
    }
    else {
      bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,InlineCachePhase);
      if ((bVar2) && ((DAT_01ec73ca & 1) != 0)) {
        CacheOperators::TraceCache
                  (inlineCache,L"PatchGetMethod",propertyId,scriptContext_00,
                   (RecyclableObject *)info._56_8_);
      }
      functionBody_local =
           (FunctionBody *)
           PatchGetMethodFromObject
                     (instance,(RecyclableObject *)info._56_8_,propertyId,
                      (PropertyValueInfo *)local_88,scriptContext_00,(bool)(value._7_1_ & 1));
    }
  }
  return functionBody_local;
}

Assistant:

inline Var JavascriptOperators::PatchScopedGetMethod(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, Var instance, PropertyId propertyId)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_ScopedGetMethod);
        Assert(inlineCache != nullptr);

        ScriptContext *const scriptContext = functionBody->GetScriptContext();

        RecyclableObject* object = nullptr;
        if (FALSE == JavascriptOperators::GetPropertyObject(instance, scriptContext, &object))
        {
            // Don't error if we disabled implicit calls
            if (scriptContext->GetThreadContext()->RecordImplicitException())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_CannotGet_NullOrUndefined,
                    scriptContext->GetPropertyName(propertyId)->GetBuffer());
            }
            else
            {
                return scriptContext->GetLibrary()->GetUndefined();
            }
        }

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, !IsFromFullJit);
        const bool isRoot = VarIs<RootObjectBase>(object);
        Var value;
        if (CacheOperators::TryGetProperty<true, true, true, false, true, false, !TInlineCache::IsPolymorphic, TInlineCache::IsPolymorphic, false, false>(
                instance, isRoot, object, propertyId, &value, scriptContext, nullptr, &info))
        {
            return value;
        }

#if DBG_DUMP
        if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
        {
            CacheOperators::TraceCache(inlineCache, _u("PatchGetMethod"), propertyId, scriptContext, object);
        }
#endif

        return Js::JavascriptOperators::PatchGetMethodFromObject(instance, object, propertyId, &info, scriptContext, isRoot);
        JIT_HELPER_END(Op_ScopedGetMethod);
    }